

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O0

bool __thiscall dielectric::scatter(dielectric *this,ray *r_in,hit_record *rec,scatter_record *srec)

{
  scatter_record *origin;
  vec3 *pvVar1;
  double dVar2;
  double dVar3;
  double time;
  double local_130;
  ray local_120;
  vec3 local_e8;
  vec3 local_d0;
  undefined1 local_b8 [8];
  vec3 direction;
  bool cannot_refract;
  double sin_theta;
  double local_78;
  double cos_theta;
  vec3 unit_direction;
  double ri;
  vec3 local_40;
  scatter_record *local_28;
  scatter_record *srec_local;
  hit_record *rec_local;
  ray *r_in_local;
  dielectric *this_local;
  
  local_28 = srec;
  srec_local = (scatter_record *)rec;
  rec_local = (hit_record *)r_in;
  r_in_local = (ray *)this;
  vec3::vec3(&local_40,1.0,1.0,1.0);
  (local_28->attenuation).e[0] = local_40.e[0];
  (local_28->attenuation).e[1] = local_40.e[1];
  (local_28->attenuation).e[2] = local_40.e[2];
  std::shared_ptr<pdf>::shared_ptr((shared_ptr<pdf> *)&ri,(nullptr_t)0x0);
  std::shared_ptr<pdf>::operator=(&local_28->pdf_ptr,(shared_ptr<pdf> *)&ri);
  std::shared_ptr<pdf>::~shared_ptr((shared_ptr<pdf> *)&ri);
  local_28->skip_pdf = true;
  if (((ulong)(srec_local->skip_pdf_ray).dir.e[2] & 1) == 0) {
    local_130 = this->refraction_index;
  }
  else {
    local_130 = 1.0 / this->refraction_index;
  }
  unit_direction.e[2] = local_130;
  pvVar1 = ray::direction((ray *)rec_local);
  unit_vector((vec3 *)&cos_theta,pvVar1);
  vec3::operator-((vec3 *)&sin_theta,(vec3 *)&cos_theta);
  local_78 = dot((vec3 *)&sin_theta,(vec3 *)&srec_local->pdf_ptr);
  if (1.0 <= local_78) {
    local_78 = 1.0;
  }
  dVar2 = sqrt(-local_78 * local_78 + 1.0);
  direction.e[2]._7_1_ = 1.0 < unit_direction.e[2] * dVar2;
  vec3::vec3((vec3 *)local_b8);
  if ((direction.e[2]._7_1_ & 1) == 0) {
    dVar2 = reflectance(local_78,unit_direction.e[2]);
    dVar3 = random_double();
    if (dVar2 <= dVar3) {
      pvVar1 = (vec3 *)&cos_theta;
      refract(&local_e8,pvVar1,(vec3 *)&srec_local->pdf_ptr,unit_direction.e[2]);
      local_b8 = (undefined1  [8])local_e8.e[0];
      direction.e[0] = local_e8.e[1];
      direction.e[1] = local_e8.e[2];
      goto LAB_001233b9;
    }
  }
  pvVar1 = (vec3 *)&cos_theta;
  reflect(&local_d0,pvVar1,(vec3 *)&srec_local->pdf_ptr);
  local_b8 = (undefined1  [8])local_d0.e[0];
  direction.e[0] = local_d0.e[1];
  direction.e[1] = local_d0.e[2];
LAB_001233b9:
  origin = srec_local;
  ray::time((ray *)rec_local,(time_t *)pvVar1);
  ray::ray(&local_120,&origin->attenuation,(vec3 *)local_b8,time);
  memcpy(&local_28->skip_pdf_ray,&local_120,0x38);
  return true;
}

Assistant:

bool scatter(const ray& r_in, const hit_record& rec, scatter_record& srec) const override {
        srec.attenuation = color(1.0, 1.0, 1.0);
        srec.pdf_ptr = nullptr;
        srec.skip_pdf = true;
        double ri = rec.front_face ? (1.0/refraction_index) : refraction_index;

        vec3 unit_direction = unit_vector(r_in.direction());
        double cos_theta = std::fmin(dot(-unit_direction, rec.normal), 1.0);
        double sin_theta = std::sqrt(1.0 - cos_theta*cos_theta);

        bool cannot_refract = ri * sin_theta > 1.0;
        vec3 direction;

        if (cannot_refract || reflectance(cos_theta, ri) > random_double())
            direction = reflect(unit_direction, rec.normal);
        else
            direction = refract(unit_direction, rec.normal, ri);

        srec.skip_pdf_ray = ray(rec.p, direction, r_in.time());
        return true;
    }